

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_IgnoredRepeatedDeleteTest_Test::
~ComparisonTest_IgnoredRepeatedDeleteTest_Test(ComparisonTest_IgnoredRepeatedDeleteTest_Test *this)

{
  ComparisonTest_IgnoredRepeatedDeleteTest_Test *this_local;
  
  ~ComparisonTest_IgnoredRepeatedDeleteTest_Test(this);
  operator_delete(this,0x1118);
  return;
}

Assistant:

TEST_F(ComparisonTest, IgnoredRepeatedDeleteTest) {
  proto1diff_.add_rv(3);
  proto1diff_.add_rv(4);
  proto1diff_.add_rv(5);

  proto2diff_.add_rv(3);
  proto2diff_.add_rv(4);

  proto2diff_.set_w("foo");

  ignore_field("rv");

  EXPECT_EQ(
      "ignored: rv\n"
      "added: w: \"foo\"\n",
      RunDiff());
}